

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  TestInfo *pTVar1;
  bool bVar2;
  reference ppTVar3;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar4;
  TestInfo *pTVar5;
  reference ppTVar6;
  char *pcVar7;
  FILE *pFVar8;
  undefined8 uVar9;
  ostream *local_330;
  ostream *local_328;
  string local_300;
  string local_2e0 [32];
  JsonUnitTestResultPrinter local_2c0;
  string local_298 [32];
  XmlUnitTestResultPrinter local_278;
  stringstream local_250 [8];
  stringstream stream;
  ostream aoStack_240 [383];
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0;
  FILE *local_80;
  FILE *fileout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string *output_format;
  TestInfo *test_info;
  size_t j;
  TestSuite *pTStack_38;
  bool printed_test_suite_name;
  TestSuite *test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int kMaxParamLength;
  UnitTestImpl *this_local;
  
  __end2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                     (&this->test_suites_);
  test_suite = (TestSuite *)
               std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                         (&this->test_suites_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                                     *)&test_suite), bVar2) {
    ppTVar3 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&__end2);
    pTStack_38 = *ppTVar3;
    j._7_1_ = 0;
    test_info = (TestInfo *)0x0;
    while( true ) {
      pTVar1 = test_info;
      pvVar4 = TestSuite::test_info_list(pTStack_38);
      pTVar5 = (TestInfo *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar4);
      if (pTVar5 <= pTVar1) break;
      pvVar4 = TestSuite::test_info_list(pTStack_38);
      ppTVar6 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar4,(size_type)test_info);
      output_format = &(*ppTVar6)->test_suite_name_;
      if ((((value_type)output_format)->matches_filter_ & 1U) != 0) {
        if ((j._7_1_ & 1) == 0) {
          j._7_1_ = 1;
          pcVar7 = TestSuite::name(pTStack_38);
          printf("%s.",pcVar7);
          pcVar7 = TestSuite::type_param(pTStack_38);
          if (pcVar7 != (char *)0x0) {
            printf("  # %s = ","TypeParam");
            pcVar7 = TestSuite::type_param(pTStack_38);
            PrintOnOneLine(pcVar7,0xfa);
          }
          printf("\n");
        }
        pcVar7 = TestInfo::name((TestInfo *)output_format);
        printf("  %s",pcVar7);
        pcVar7 = TestInfo::value_param((TestInfo *)output_format);
        if (pcVar7 != (char *)0x0) {
          printf("  # %s = ","GetParam()");
          pcVar7 = TestInfo::value_param((TestInfo *)output_format);
          PrintOnOneLine(pcVar7,0xfa);
        }
        printf("\n");
      }
      test_info = (TestInfo *)&(test_info->test_suite_name_).field_0x1;
    }
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&__end2);
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileout;
  bVar2 = std::operator==(local_58,"xml");
  if ((bVar2) || (bVar2 = std::operator==(local_58,"json"), bVar2)) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar7,&local_c1);
    pFVar8 = (FILE *)OpenFileForWriting(&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string(local_c0);
    local_80 = pFVar8;
    std::__cxx11::stringstream::stringstream(local_250);
    bVar2 = std::operator==(local_58,"xml");
    if (bVar2) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(&local_278,pcVar7);
      local_328 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x250) {
        local_328 = aoStack_240;
      }
      XmlUnitTestResultPrinter::PrintXmlTestsList(local_328,&this->test_suites_);
      XmlUnitTestResultPrinter::~XmlUnitTestResultPrinter(&local_278);
      std::__cxx11::string::~string(local_298);
    }
    else {
      bVar2 = std::operator==(local_58,"json");
      if (bVar2) {
        UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(&local_2c0,pcVar7);
        local_330 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x250) {
          local_330 = aoStack_240;
        }
        JsonUnitTestResultPrinter::PrintJsonTestList(local_330,&this->test_suites_);
        JsonUnitTestResultPrinter::~JsonUnitTestResultPrinter(&local_2c0);
        std::__cxx11::string::~string(local_2e0);
      }
    }
    pFVar8 = local_80;
    StringStreamToString(&local_300,(stringstream *)local_250);
    uVar9 = std::__cxx11::string::c_str();
    fprintf(pFVar8,"%s",uVar9);
    std::__cxx11::string::~string((string *)&local_300);
    fclose(local_80);
    std::__cxx11::stringstream::~stringstream(local_250);
  }
  std::__cxx11::string::~string((string *)&fileout);
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (auto* test_suite : test_suites_) {
    bool printed_test_suite_name = false;

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      const TestInfo* const test_info = test_suite->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_suite_name) {
          printed_test_suite_name = true;
          printf("%s.", test_suite->name());
          if (test_suite->type_param() != nullptr) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_suite->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != nullptr) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml" || output_format == "json") {
    FILE* fileout = OpenFileForWriting(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str());
    std::stringstream stream;
    if (output_format == "xml") {
      XmlUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintXmlTestsList(&stream, test_suites_);
    } else if (output_format == "json") {
      JsonUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintJsonTestList(&stream, test_suites_);
    }
    fprintf(fileout, "%s", StringStreamToString(&stream).c_str());
    fclose(fileout);
  }
}